

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const(&)[22],kj::StringPtr,char_const(&)[35],kj::StringPtr,char_const(&)[28]>
          (String *__return_storage_ptr__,kj *this,char (*params) [22],StringPtr *params_1,
          char (*params_2) [35],StringPtr *params_3,char (*params_4) [28])

{
  ArrayPtr<const_char> *in_stack_ffffffffffffff78;
  kj *local_80;
  size_t local_78;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_78 = strlen((char *)this);
  local_40.ptr = *(char **)*params;
  local_40.size_ = *(long *)(*params + 8) - 1;
  local_80 = this;
  local_50.size_ = strlen((char *)params_1);
  local_60.ptr = *(char **)*params_2;
  local_60.size_ = *(long *)(*params_2 + 8) - 1;
  local_50.ptr = (char *)params_1;
  local_70.size_ = strlen((char *)params_3);
  local_70.ptr = (char *)params_3;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_80,&local_40,&local_50,&local_60,&local_70,
             in_stack_ffffffffffffff78);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}